

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

int __thiscall luna::Lexer::LexXEqual(Lexer *this,TokenDetail *detail,int equal_token)

{
  int iVar1;
  int iVar2;
  
  iVar2 = this->current_;
  iVar1 = Next(this);
  if (iVar1 == 0x3d) {
    iVar1 = Next(this);
    iVar2 = equal_token;
  }
  this->current_ = iVar1;
  detail->token_ = iVar2;
  iVar1 = this->column_;
  detail->line_ = this->line_;
  detail->column_ = iVar1;
  detail->module_ = this->module_;
  return iVar2;
}

Assistant:

int Lexer::LexXEqual(TokenDetail *detail, int equal_token)
    {
        int token = current_;

        int next = Next();
        if (next == '=')
        {
            current_ = Next();
            RETURN_NORMAL_TOKEN_DETAIL(detail, equal_token);
        }
        else
        {
            current_ = next;
            RETURN_NORMAL_TOKEN_DETAIL(detail, token);
        }
    }